

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O3

bool toml::detail::skip_whitespace<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  initializer_list<unsigned_char> cs;
  uchar local_b2 [2];
  repeat_at_least local_b0;
  character_either local_98;
  region local_78;
  
  local_b2[0] = ' ';
  local_b2[1] = '\t';
  cs._M_len = 2;
  cs._M_array = local_b2;
  character_either::character_either(&local_98,cs);
  local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_004cfb68;
  local_b0.length_ = 0;
  scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
            (&local_b0.other_,&local_98);
  if (local_98.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.chars_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  repeat_at_least::scan(&local_78,&local_b0,loc);
  region::~region(&local_78);
  if (local_b0.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_b0.other_.scanner_._M_t.
                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl +
                8))();
  }
  return local_78.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr != (element_type *)0x0;
}

Assistant:

bool skip_whitespace(location& loc, const context<TC>& ctx)
{
    return syntax::ws(ctx.toml_spec()).scan(loc).is_ok();
}